

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::TriageCompareEdgeDirections<long_double>
              (Vector3<long_double> *a0,Vector3<long_double> *a1,Vector3<long_double> *b0,
              Vector3<long_double> *b1)

{
  D *__return_storage_ptr__;
  D *b;
  BasicVector<Vector3,_long_double,_3UL> *this;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar1;
  longdouble in_ST2;
  __type_conflict _Var2;
  __type_conflict _Var3;
  int local_1fc;
  longdouble cos_ab_error;
  longdouble cos_ab;
  longdouble nb_len;
  longdouble na_len;
  BasicVector<Vector3,_long_double,_3UL> local_128 [48];
  BasicVector<Vector3,_long_double,_3UL> local_f8 [8];
  Vector3<long_double> nb;
  D local_98;
  undefined1 local_68 [8];
  Vector3<long_double> na;
  longdouble T_ERR;
  Vector3<long_double> *b1_local;
  Vector3<long_double> *b0_local;
  Vector3<long_double> *a1_local;
  Vector3<long_double> *a0_local;
  
  unique0x10000121 = (longdouble)5.421011e-20;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            (&local_98,(BasicVector<Vector3,_long_double,_3UL> *)a0,a1);
  __return_storage_ptr__ = (D *)((long)nb.c_ + 0x28);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator+
            (__return_storage_ptr__,(BasicVector<Vector3,_long_double,_3UL> *)a0,a1);
  Vector3<long_double>::CrossProd((Vector3<long_double> *)local_68,&local_98,__return_storage_ptr__)
  ;
  this = local_128;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((D *)this,(BasicVector<Vector3,_long_double,_3UL> *)b0,b1);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator+
            ((D *)((long)&na_len + 8),(BasicVector<Vector3,_long_double,_3UL> *)b0,b1);
  Vector3<long_double>::CrossProd
            ((Vector3<long_double> *)local_f8,(Vector3<long_double> *)this,(D *)((long)&na_len + 8))
  ;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
            ((FloatType *)local_68,this);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
            ((FloatType *)local_f8,this);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::DotProd
            ((longdouble *)local_68,local_f8,b);
  _Var2 = std::sqrt<int>(3);
  _Var3 = std::sqrt<int>(3);
  lVar1 = (longdouble)5.421011e-20 *
          ((in_ST1 + in_ST0) * (longdouble)(_Var3 * 32.0 * 1.1102230246251565e-16) +
          in_ST1 * in_ST0 * (longdouble)(_Var2 * 4.0 + 5.0));
  if (in_ST2 <= lVar1) {
    local_1fc = -(uint)(in_ST2 < -lVar1);
  }
  else {
    local_1fc = 1;
  }
  return local_1fc;
}

Assistant:

int TriageCompareEdgeDirections(
    const Vector3<T>& a0, const Vector3<T>& a1,
    const Vector3<T>& b0, const Vector3<T>& b1) {
  constexpr T T_ERR = rounding_epsilon<T>();
  Vector3<T> na = (a0 - a1).CrossProd(a0 + a1);
  Vector3<T> nb = (b0 - b1).CrossProd(b0 + b1);
  T na_len = na.Norm(), nb_len = nb.Norm();
  T cos_ab = na.DotProd(nb);
  T cos_ab_error = ((5 + 4 * sqrt(3)) * na_len * nb_len +
                    32 * sqrt(3) * DBL_ERR * (na_len + nb_len)) * T_ERR;
  return (cos_ab > cos_ab_error) ? 1 : (cos_ab < -cos_ab_error) ? -1 : 0;
}